

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBcontig8bitCMYKtile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (h == 0) {
    return;
  }
  uVar3 = (ulong)img->samplesperpixel;
  if (w < 8) {
    uVar4 = (ulong)w;
  }
  else {
    uVar4 = (ulong)w;
    do {
      uVar5 = pp[3] ^ 0xff;
      *cp = (pp[2] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
            (pp[1] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 | ((*pp ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + 3] ^ 0xff;
      lVar1 = uVar3 + 3;
      cp[1] = (pp[uVar3 + 2] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[uVar3 + 1] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[uVar3] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar1] ^ 0xff;
      lVar2 = uVar3 + lVar1;
      cp[2] = (pp[(uVar3 - 1) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar1] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar2] ^ 0xff;
      lVar1 = uVar3 + lVar2;
      cp[3] = (pp[(uVar3 - 1) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar1] ^ 0xff;
      lVar2 = uVar3 + lVar1;
      cp[4] = (pp[(uVar3 - 1) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar1] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar2] ^ 0xff;
      lVar1 = uVar3 + lVar2;
      cp[5] = (pp[(uVar3 - 1) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar1] ^ 0xff;
      lVar2 = uVar3 + lVar1;
      cp[6] = (pp[(uVar3 - 1) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar1] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar1] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar3 + lVar2] ^ 0xff;
      cp[7] = (pp[(uVar3 - 1) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 7 & 0xff0000 | 0xff000000 |
              (pp[(uVar3 - 2) + lVar2] ^ 0xff) * uVar5 * 0x8081 >> 0xf & 0x1ff00 |
              ((pp[(uVar3 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      cp = cp + 8;
      uVar5 = (int)uVar4 - 8;
      uVar4 = (ulong)uVar5;
      pp = pp + uVar3 * 2 + -3 + lVar2;
    } while (7 < uVar5);
  }
  (*(code *)(&DAT_0032f93c + *(int *)(&DAT_0032f93c + uVar4 * 4)))();
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t r, g, b, k;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, k = 255 - pp[3]; r = (k * (255 - pp[0])) / 255;
                g = (k * (255 - pp[1])) / 255; b = (k * (255 - pp[2])) / 255;
                *cp++ = PACK(r, g, b); pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}